

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O1

bool mg::fs::read_file(char *path,string *out)

{
  int __fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ssize_t sVar1;
  bool bVar2;
  undefined1 local_1048 [8];
  char buffer [4096];
  
  __fd = open(path,0);
  if (__fd == -1) {
    read_file((fs *)path);
    bVar2 = false;
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00108d18;
    *(int *)&this[1]._vptr__Sp_counted_base = __fd;
    this[1]._M_use_count = 0;
    this[1]._M_weak_count = 0;
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
    do {
      sVar1 = read(__fd,local_1048,0x1000);
      bVar2 = sVar1 != -1;
      if (sVar1 == -1) {
        read_file((fs *)path);
        break;
      }
      std::__cxx11::string::append((char *)out,(ulong)local_1048);
    } while (sVar1 == 0x1000);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return bVar2;
}

Assistant:

bool read_file(const char *path, std::string &out) {
  // Open file
  const int fd = open(path, O_RDONLY);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  static const size_t read_blocksz = 4096;
  char buffer[read_blocksz];
  out.clear();
  ssize_t bytes_read = 0;
  do {
    bytes_read = read(fd, buffer, read_blocksz);
    if (bytes_read == -1) {
      fprintf(stderr, "Failed to read '%s' - %s\n", path, strerror(errno));
      return false;
    }
    out.append(buffer, bytes_read);
  } while (bytes_read == read_blocksz);

  return true;
}